

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  float *pfVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  float fVar8;
  int local_64;
  float *pDelayTable;
  int nBoxOutputs;
  int nBoxInputs;
  int LevelMax;
  int curCo;
  int curCi;
  int j;
  int k;
  int i;
  Gia_Obj_t *pObjIn;
  Gia_Obj_t *pObj;
  Tim_Man_t *pManTime;
  int nAnd2Delay;
  Gia_Man_t *p_local;
  
  if (p->nAnd2Delay == 0) {
    local_64 = 1;
  }
  else {
    local_64 = p->nAnd2Delay;
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x1e3,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  iVar1 = Gia_ManBufNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x1e4,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  Gia_ManCleanLevels(p,iVar1);
  pGVar4 = Gia_ManConst0(p);
  Gia_ObjSetLevel(p,pGVar4,0);
  Gia_ManIncrementTravId(p);
  pGVar4 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar4);
  for (j = 0; iVar1 = Tim_ManPiNum(p_00), j < iVar1; j = j + 1) {
    pGVar4 = Gia_ManCi(p,j);
    fVar8 = Tim_ManGetCiArrival(p_00,j);
    Gia_ObjSetLevel(p,pGVar4,(int)(fVar8 / (float)local_64));
    Gia_ObjSetTravIdCurrent(p,pGVar4);
  }
  LevelMax = Tim_ManPiNum(p_00);
  nBoxInputs = 0;
  for (j = 0; iVar1 = Tim_ManBoxNum(p_00), j < iVar1; j = j + 1) {
    iVar1 = Tim_ManBoxInputNum(p_00,j);
    iVar2 = Tim_ManBoxOutputNum(p_00,j);
    pfVar5 = Tim_ManBoxDelayTable(p_00,j);
    for (curCi = 0; curCi < iVar1; curCi = curCi + 1) {
      pGVar4 = Gia_ManCo(p,nBoxInputs + curCi);
      pGVar6 = Gia_ObjFanin0(pGVar4);
      iVar3 = Gia_ManLevelWithBoxes_rec(p,pGVar6);
      if (iVar3 != 0) {
        printf(
              "Boxes are not in a topological order. Switching to level computation without boxes.\n"
              );
        iVar1 = Gia_ManLevelNum(p);
        return iVar1;
      }
      Gia_ObjSetCoLevel(p,pGVar4);
    }
    for (curCi = 0; curCi < iVar2; curCi = curCi + 1) {
      pGVar4 = Gia_ManCi(p,LevelMax + curCi);
      Gia_ObjSetTravIdCurrent(p,pGVar4);
      nBoxOutputs = 0;
      if (iVar1 != (int)pfVar5[1]) {
        __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x20b,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
      }
      curCo = 0;
      while( true ) {
        bVar7 = false;
        if (curCo < iVar1) {
          _k = Gia_ManCo(p,nBoxInputs + curCo);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        if ((int)pfVar5[curCi * iVar1 + 3 + curCo] != -1000000000) {
          iVar3 = Gia_ObjLevel(p,_k);
          nBoxOutputs = Abc_MaxInt(nBoxOutputs,
                                   iVar3 + (int)pfVar5[curCi * iVar1 + 3 + curCo] / local_64);
        }
        curCo = curCo + 1;
      }
      Gia_ObjSetLevel(p,pGVar4,nBoxOutputs);
    }
    nBoxInputs = iVar1 + nBoxInputs;
    LevelMax = iVar2 + LevelMax;
  }
  p->nLevels = 0;
  iVar1 = Tim_ManCoNum(p_00);
  iVar2 = Tim_ManPoNum(p_00);
  for (j = iVar1 - iVar2; iVar1 = Tim_ManCoNum(p_00), j < iVar1; j = j + 1) {
    pGVar4 = Gia_ManCo(p,j);
    pGVar6 = Gia_ObjFanin0(pGVar4);
    Gia_ManLevelWithBoxes_rec(p,pGVar6);
    Gia_ObjSetCoLevel(p,pGVar4);
    iVar1 = p->nLevels;
    iVar2 = Gia_ObjLevel(p,pGVar4);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    p->nLevels = iVar1;
  }
  iVar1 = Tim_ManPoNum(p_00);
  iVar2 = Gia_ManCiNum(p);
  if (LevelMax == iVar2) {
    iVar2 = Gia_ManCoNum(p);
    if (iVar1 + nBoxInputs == iVar2) {
      return p->nLevels;
    }
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x221,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  __assert_fail("curCi == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                ,0x220,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
}

Assistant:

int Gia_ManLevelWithBoxes( Gia_Man_t * p )
{
    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBufNum(p) == 0 );
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}